

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

void __thiscall
t_haxe_generator::generate_service_helpers(t_haxe_generator *this,t_service *tservice)

{
  ostream *poVar1;
  pointer pptVar2;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_30;
  
  poVar1 = std::operator<<((ostream *)&this->f_service_,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_30,&tservice->functions_)
  ;
  for (pptVar2 = local_30._M_impl.super__Vector_impl_data._M_start;
      pptVar2 != local_30._M_impl.super__Vector_impl_data._M_finish; pptVar2 = pptVar2 + 1) {
    generate_haxe_struct(this,(*pptVar2)->arglist_,false,false);
    generate_function_helpers(this,*pptVar2);
  }
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void t_haxe_generator::generate_service_helpers(t_service* tservice) {
  f_service_ << endl << endl;
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    t_struct* ts = (*f_iter)->get_arglist();
    generate_haxe_struct(ts, false);
    generate_function_helpers(*f_iter);
  }
}